

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O2

bool bssl::dtls_has_unprocessed_handshake_data(SSL *ssl)

{
  ushort uVar1;
  DTLS1_STATE *pDVar2;
  bool bVar3;
  ulong uVar4;
  
  pDVar2 = ssl->d1;
  uVar1 = pDVar2->handshake_read_seq;
  for (uVar4 = 0; uVar4 != 7; uVar4 = uVar4 + 1) {
    if (((ssl->s3->field_0xdc & 8) == 0) || (uVar1 % 7 != uVar4)) {
      if ((DTLSIncomingMessage *)
          pDVar2->incoming_messages[uVar4]._M_t.
          super___uniq_ptr_impl<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bssl::DTLSIncomingMessage_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false> != (DTLSIncomingMessage *)0x0)
      break;
    }
    else {
      bVar3 = dtls1_is_current_message_complete(ssl);
      if (!bVar3) {
        __assert_fail("dtls1_is_current_message_complete(ssl)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                      ,0x1d9,"bool bssl::dtls_has_unprocessed_handshake_data(const SSL *)");
      }
    }
  }
  return uVar4 < 7;
}

Assistant:

bool dtls_has_unprocessed_handshake_data(const SSL *ssl) {
  size_t current = ssl->d1->handshake_read_seq % SSL_MAX_HANDSHAKE_FLIGHT;
  for (size_t i = 0; i < SSL_MAX_HANDSHAKE_FLIGHT; i++) {
    // Skip the current message.
    if (ssl->s3->has_message && i == current) {
      assert(dtls1_is_current_message_complete(ssl));
      continue;
    }
    if (ssl->d1->incoming_messages[i] != nullptr) {
      return true;
    }
  }
  return false;
}